

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

Material * __thiscall btSoftBody::appendMaterial(btSoftBody *this)

{
  Material *pMVar1;
  Material **ptr;
  btScalar bVar2;
  btScalar bVar3;
  uint uVar4;
  Material *pMVar5;
  Material **ppMVar6;
  ulong uVar7;
  int iVar8;
  
  pMVar5 = (Material *)btAlignedAllocInternal(0x18,0x10);
  (pMVar5->super_Element).m_tag = (void *)0x0;
  pMVar5->m_kLST = 0.0;
  pMVar5->m_kAST = 0.0;
  pMVar5->m_kVST = 0.0;
  pMVar5->m_flags = 0;
  if ((this->m_materials).m_size < 1) {
    (pMVar5->super_Element).m_tag = (void *)0x0;
    pMVar5->m_kLST = 0.0;
    pMVar5->m_kAST = 0.0;
    pMVar5->m_kVST = 0.0;
    pMVar5->m_flags = 0;
  }
  else {
    pMVar1 = *(this->m_materials).m_data;
    iVar8 = pMVar1->m_flags;
    pMVar5->m_kVST = pMVar1->m_kVST;
    pMVar5->m_flags = iVar8;
    bVar2 = pMVar1->m_kLST;
    bVar3 = pMVar1->m_kAST;
    (pMVar5->super_Element).m_tag = (pMVar1->super_Element).m_tag;
    pMVar5->m_kLST = bVar2;
    pMVar5->m_kAST = bVar3;
  }
  uVar4 = (this->m_materials).m_size;
  if (uVar4 == (this->m_materials).m_capacity) {
    iVar8 = 1;
    if (uVar4 != 0) {
      iVar8 = uVar4 * 2;
    }
    if ((int)uVar4 < iVar8) {
      if (iVar8 == 0) {
        ppMVar6 = (Material **)0x0;
      }
      else {
        ppMVar6 = (Material **)btAlignedAllocInternal((long)iVar8 << 3,0x10);
        uVar4 = (this->m_materials).m_size;
      }
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          ppMVar6[uVar7] = (this->m_materials).m_data[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
      }
      ptr = (this->m_materials).m_data;
      if ((ptr != (Material **)0x0) && ((this->m_materials).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar4 = (this->m_materials).m_size;
      }
      (this->m_materials).m_ownsMemory = true;
      (this->m_materials).m_data = ppMVar6;
      (this->m_materials).m_capacity = iVar8;
    }
  }
  (this->m_materials).m_data[(int)uVar4] = pMVar5;
  (this->m_materials).m_size = uVar4 + 1;
  return pMVar5;
}

Assistant:

btSoftBody::Material*		btSoftBody::appendMaterial()
{
	Material*	pm=new(btAlignedAlloc(sizeof(Material),16)) Material();
	if(m_materials.size()>0)
		*pm=*m_materials[0];
	else
		ZeroInitialize(*pm);
	m_materials.push_back(pm);
	return(pm);
}